

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O1

void __thiscall
entityx::EventManager::
emit<entityx::ComponentAddedEvent<Counter>,entityx::Entity,entityx::ComponentHandle<Counter,entityx::EntityManager>&>
          (EventManager *this,Entity *args,ComponentHandle<Counter,_entityx::EntityManager> *args_1)

{
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Family id;
  EventSignalPtr *pEVar1;
  ComponentAddedEvent<Counter> event;
  undefined **local_38;
  EntityManager *local_30;
  uint64_t uStack_28;
  EntityManager *local_20;
  uint64_t uStack_18;
  
  local_30 = args->manager_;
  uStack_28 = (args->id_).id_;
  local_20 = args_1->manager_;
  uStack_18 = (args_1->id_).id_;
  local_38 = &PTR__BaseEvent_001d0b80;
  id = Event<entityx::ComponentAddedEvent<Counter>_>::family();
  pEVar1 = signal_for(this,id);
  this_00 = &((pEVar1->
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->
             super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>;
  this_01 = (pEVar1->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::emit
            (this_00,&local_38);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  entityx::BaseEvent::~BaseEvent((BaseEvent *)&local_38);
  return;
}

Assistant:

void emit(Args && ... args) {
    // Using 'E event(std::forward...)' causes VS to fail with an internal error. Hack around it.
    E event = E(std::forward<Args>(args) ...);
    auto sig = signal_for(std::size_t(Event<E>::family()));
    sig->emit(&event);
  }